

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

void av1_count_colors_highbd
               (uint8_t *src8,int stride,int rows,int cols,int bit_depth,int *val_count,
               int *bin_val_count,int *num_color_bins,int *num_colors)

{
  int *piVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  uVar7 = 1 << ((byte)bit_depth & 0x1f);
  memset(bin_val_count,0,0x400);
  if (val_count != (int *)0x0) {
    memset(val_count,0,(long)(int)uVar7 << 2);
  }
  if (0 < rows) {
    lVar6 = (long)src8 * 2;
    uVar3 = 0;
    do {
      if (0 < cols) {
        uVar4 = 0;
        do {
          uVar2 = *(ushort *)(lVar6 + uVar4 * 2);
          uVar5 = (uint)(uVar2 >> ((byte)bit_depth - 8 & 0x1f));
          if ((uVar5 < 0x100) &&
             (bin_val_count[uVar5] = bin_val_count[uVar5] + 1, val_count != (int *)0x0)) {
            val_count[uVar2] = val_count[uVar2] + 1;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)cols != uVar4);
      }
      uVar3 = uVar3 + 1;
      lVar6 = lVar6 + (long)stride * 2;
    } while (uVar3 != (uint)rows);
  }
  lVar6 = 0;
  iVar8 = 0;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  do {
    piVar1 = bin_val_count + lVar6;
    iVar8 = (iVar8 - (uint)(*piVar1 == 0)) + 1;
    iVar9 = (iVar9 - (uint)(piVar1[1] == 0)) + 1;
    iVar10 = (iVar10 - (uint)(piVar1[2] == 0)) + 1;
    iVar11 = (iVar11 - (uint)(piVar1[3] == 0)) + 1;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x100);
  *num_color_bins = iVar11 + iVar9 + iVar10 + iVar8;
  if (val_count != (int *)0x0) {
    iVar8 = 0;
    if (bit_depth != 0x1f) {
      uVar3 = 1;
      if (1 < (int)uVar7) {
        uVar3 = (ulong)uVar7;
      }
      uVar4 = 0;
      iVar8 = 0;
      do {
        iVar8 = (iVar8 + 1) - (uint)(val_count[uVar4] == 0);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    *num_colors = iVar8;
  }
  return;
}

Assistant:

void av1_count_colors_highbd(const uint8_t *src8, int stride, int rows,
                             int cols, int bit_depth, int *val_count,
                             int *bin_val_count, int *num_color_bins,
                             int *num_colors) {
  assert(bit_depth <= 12);
  const int max_bin_val = 1 << 8;
  const int max_pix_val = 1 << bit_depth;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  memset(bin_val_count, 0, max_bin_val * sizeof(val_count[0]));
  if (val_count != NULL)
    memset(val_count, 0, max_pix_val * sizeof(val_count[0]));
  for (int r = 0; r < rows; ++r) {
    for (int c = 0; c < cols; ++c) {
      /*
       * Down-convert the pixels to 8-bit domain before counting.
       * This provides consistency of behavior for palette search
       * between lbd and hbd encodes. This down-converted pixels
       * are only used for calculating the threshold (n).
       */
      const int this_val = ((src[r * stride + c]) >> (bit_depth - 8));
      assert(this_val < max_bin_val);
      if (this_val >= max_bin_val) continue;
      ++bin_val_count[this_val];
      if (val_count != NULL) ++val_count[(src[r * stride + c])];
    }
  }
  int n = 0;
  // Count the colors based on 8-bit domain used to gate the palette path
  for (int i = 0; i < max_bin_val; ++i) {
    if (bin_val_count[i]) ++n;
  }
  *num_color_bins = n;

  // Count the actual hbd colors used to create top_colors
  n = 0;
  if (val_count != NULL) {
    for (int i = 0; i < max_pix_val; ++i) {
      if (val_count[i]) ++n;
    }
    *num_colors = n;
  }
}